

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

size_t __thiscall Assimp::CFIReaderImpl::parseNonEmptyOctetString5Length(CFIReaderImpl *this)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  size_t sVar4;
  DeadlyImportError *this_00;
  
  pbVar2 = this->dataP;
  pbVar1 = pbVar2 + 1;
  this->dataP = pbVar1;
  uVar3 = *pbVar2 & 0xf;
  if ((byte)uVar3 < 8) {
    sVar4 = (ulong)uVar3 + 1;
  }
  else if ((byte)uVar3 == 0xc) {
    if ((long)this->dataEnd - (long)pbVar1 < 4) goto LAB_0056166c;
    sVar4 = (ulong)pbVar2[4] +
            ((ulong)pbVar2[3] << 8 | (long)(int)((uint)pbVar2[1] << 0x18) | (ulong)pbVar2[2] << 0x10
            ) + 0x109;
    this->dataP = pbVar2 + 5;
  }
  else {
    if ((uVar3 != 8) || (this->dataEnd == pbVar1 || (long)this->dataEnd - (long)pbVar1 < 0)) {
LAB_0056166c:
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    this->dataP = pbVar2 + 2;
    sVar4 = (ulong)pbVar2[1] + 9;
  }
  return sVar4;
}

Assistant:

size_t parseNonEmptyOctetString5Length() { // C.23
        // Parse the length of the string
        size_t b = *dataP++ & 0x0f;
        if (!(b & 0x08)) { // xxxx0... (C.23.3.1)
            return b + 1;
        }
        else if (b == 0x08) { // xxxx1000 ........ (C.23.3.2)
            if (dataEnd - dataP > 0) {
                return *dataP++ + 0x09;
            }
        }
        else if (b == 0x0c) { // xxxx1100 ........ ........ ........ ........ (C.23.3.3)
            if (dataEnd - dataP > 3) {
                size_t result = ((dataP[0] << 24) | (dataP[1] << 16) | (dataP[2] << 8) | dataP[3]) + 0x109;
                dataP += 4;
                return result;
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }